

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::is_socket_alive(socket_t sock)

{
  ssize_t sVar1;
  int *piVar2;
  char buf [1];
  ssize_t val;
  int in_stack_0000002c;
  size_t in_stack_00000030;
  void *in_stack_00000038;
  socket_t in_stack_00000044;
  time_t in_stack_000000b8;
  time_t in_stack_000000c0;
  socket_t in_stack_000000cc;
  bool local_1;
  
  sVar1 = select_read(in_stack_000000cc,in_stack_000000c0,in_stack_000000b8);
  if (sVar1 == 0) {
    local_1 = true;
  }
  else {
    if ((sVar1 < 0) && (piVar2 = __errno_location(), *piVar2 == 9)) {
      return false;
    }
    sVar1 = read_socket(in_stack_00000044,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    local_1 = 0 < sVar1;
  }
  return local_1;
}

Assistant:

inline bool is_socket_alive(socket_t sock) {
  const auto val = detail::select_read(sock, 0, 0);
  if (val == 0) {
    return true;
  } else if (val < 0 && errno == EBADF) {
    return false;
  }
  char buf[1];
  return detail::read_socket(sock, &buf[0], sizeof(buf), MSG_PEEK) > 0;
}